

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
Analyser::getFunctionParameter
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Analyser *this,string *s)

{
  int iVar1;
  iterator iVar2;
  mapped_type *__x;
  string *psVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->_functions)._M_t,s);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_functions)._M_t._M_impl.super__Rb_tree_header) {
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::operator[](&this->_functionParameter,s);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"function is not exist","");
  iVar1 = this->_currentLine;
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_40,local_40 + local_38);
  *(long *)(psVar3 + 0x20) = (long)iVar1;
  __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

std::vector<char> Analyser::getFunctionParameter(const std::string& s)
{
	if (_functions.find(s) != _functions.end()) {
		return _functionParameter[s];
	}
	throw Error("function is not exist", _currentLine);
}